

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O3

int nghttp2_frame_unpack_settings_payload2
              (nghttp2_settings_entry **iv_ptr,size_t *niv_ptr,uint8_t *payload,size_t payloadlen,
              nghttp2_mem *mem)

{
  uint16_t uVar1;
  uint32_t uVar2;
  nghttp2_settings_entry *pnVar3;
  ulong uVar4;
  
  *niv_ptr = payloadlen / 6;
  if (payloadlen < 6) {
    *iv_ptr = (nghttp2_settings_entry *)0x0;
  }
  else {
    pnVar3 = (nghttp2_settings_entry *)nghttp2_mem_malloc(mem,payloadlen / 6 << 3);
    *iv_ptr = pnVar3;
    if (pnVar3 == (nghttp2_settings_entry *)0x0) {
      return -0x385;
    }
    if (*niv_ptr != 0) {
      uVar4 = 0;
      do {
        pnVar3 = *iv_ptr;
        uVar1 = nghttp2_get_uint16(payload);
        pnVar3[uVar4].settings_id = (uint)uVar1;
        uVar2 = nghttp2_get_uint32(payload + 2);
        pnVar3[uVar4].value = uVar2;
        uVar4 = uVar4 + 1;
        payload = payload + 6;
      } while (uVar4 < *niv_ptr);
      return 0;
    }
  }
  return 0;
}

Assistant:

int nghttp2_frame_unpack_settings_payload2(nghttp2_settings_entry **iv_ptr,
                                           size_t *niv_ptr,
                                           const uint8_t *payload,
                                           size_t payloadlen,
                                           nghttp2_mem *mem) {
  size_t i;

  *niv_ptr = payloadlen / NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH;

  if (*niv_ptr == 0) {
    *iv_ptr = NULL;

    return 0;
  }

  *iv_ptr =
      nghttp2_mem_malloc(mem, (*niv_ptr) * sizeof(nghttp2_settings_entry));

  if (*iv_ptr == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  for (i = 0; i < *niv_ptr; ++i) {
    size_t off = i * NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH;
    nghttp2_frame_unpack_settings_entry(&(*iv_ptr)[i], &payload[off]);
  }

  return 0;
}